

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommandArgumentLexer.cxx
# Opt level: O0

int cmCommandArgument_yylex_init_extra
              (cmCTestResourceGroupsLexerHelper *yy_user_defined,yyscan_t *ptr_yy_globals)

{
  int *piVar1;
  void *pvVar2;
  undefined1 local_b0 [8];
  yyguts_t dummy_yyguts;
  yyscan_t *ptr_yy_globals_local;
  cmCTestResourceGroupsLexerHelper *yy_user_defined_local;
  
  dummy_yyguts._136_8_ = ptr_yy_globals;
  cmCommandArgument_yyset_extra(yy_user_defined,local_b0);
  if (dummy_yyguts._136_8_ == 0) {
    piVar1 = __errno_location();
    *piVar1 = 0x16;
    yy_user_defined_local._4_4_ = 1;
  }
  else {
    pvVar2 = cmCommandArgument_yyalloc(0x90,local_b0);
    *(void **)dummy_yyguts._136_8_ = pvVar2;
    if (*(long *)dummy_yyguts._136_8_ == 0) {
      piVar1 = __errno_location();
      *piVar1 = 0xc;
      yy_user_defined_local._4_4_ = 1;
    }
    else {
      memset(*(void **)dummy_yyguts._136_8_,0,0x90);
      cmCommandArgument_yyset_extra(yy_user_defined,*(yyscan_t *)dummy_yyguts._136_8_);
      yy_user_defined_local._4_4_ = yy_init_globals(*(yyscan_t *)dummy_yyguts._136_8_);
    }
  }
  return yy_user_defined_local._4_4_;
}

Assistant:

int yylex_init_extra( YY_EXTRA_TYPE yy_user_defined, yyscan_t* ptr_yy_globals )
{
    struct yyguts_t dummy_yyguts;

    yyset_extra (yy_user_defined, &dummy_yyguts);

    if (ptr_yy_globals == NULL){
        errno = EINVAL;
        return 1;
    }

    *ptr_yy_globals = (yyscan_t) yyalloc ( sizeof( struct yyguts_t ), &dummy_yyguts );

    if (*ptr_yy_globals == NULL){
        errno = ENOMEM;
        return 1;
    }

    /* By setting to 0xAA, we expose bugs in
    yy_init_globals. Leave at 0x00 for releases. */
    memset(*ptr_yy_globals,0x00,sizeof(struct yyguts_t));

    yyset_extra (yy_user_defined, *ptr_yy_globals);

    return yy_init_globals ( *ptr_yy_globals );
}